

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsioContextManager.cpp
# Opt level: O2

void __thiscall gmlc::networking::AsioContextManager::~AsioContextManager(AsioContextManager *this)

{
  this->_vptr_AsioContextManager = (_func_int **)&PTR__AsioContextManager_004ad3a8;
  if ((this->running)._M_i == stopped) {
    if ((this->loopRet).super___basic_future<void>._M_state.
        super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
        (element_type *)0x0) {
      std::__basic_future<void>::_M_get_result(&(this->loopRet).super___basic_future<void>);
    }
  }
  else {
    CLI::std::mutex::lock((mutex *)&this->runningLoopLock);
    std::__uniq_ptr_impl<asio::io_context::work,_std::default_delete<asio::io_context::work>_>::
    reset((__uniq_ptr_impl<asio::io_context::work,_std::default_delete<asio::io_context::work>_> *)
          &this->nullwork,(pointer)0x0);
    asio::io_context::stop
              ((this->ictx)._M_t.
               super___uniq_ptr_impl<asio::io_context,_std::default_delete<asio::io_context>_>._M_t.
               super__Tuple_impl<0UL,_asio::io_context_*,_std::default_delete<asio::io_context>_>.
               super__Head_base<0UL,_asio::io_context_*,_false>._M_head_impl);
    std::__basic_future<void>::_M_get_result(&(this->loopRet).super___basic_future<void>);
    pthread_mutex_unlock((pthread_mutex_t *)&this->runningLoopLock);
  }
  if (this->leakOnDelete == true) {
    (this->ictx)._M_t.
    super___uniq_ptr_impl<asio::io_context,_std::default_delete<asio::io_context>_>._M_t.
    super__Tuple_impl<0UL,_asio::io_context_*,_std::default_delete<asio::io_context>_>.
    super__Head_base<0UL,_asio::io_context_*,_false>._M_head_impl = (io_context *)0x0;
  }
  CLI::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&(this->loopRet).super___basic_future<void>._M_state.
              super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::unique_ptr<asio::io_context::work,_std::default_delete<asio::io_context::work>_>::~unique_ptr
            (&this->nullwork);
  std::unique_ptr<asio::io_context,_std::default_delete<asio::io_context>_>::~unique_ptr
            (&this->ictx);
  std::__cxx11::string::~string((string *)&this->name);
  std::__weak_count<(__gnu_cxx::_Lock_policy)2>::~__weak_count
            (&(this->super_enable_shared_from_this<gmlc::networking::AsioContextManager>).
              _M_weak_this.
              super___weak_ptr<gmlc::networking::AsioContextManager,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  return;
}

Assistant:

AsioContextManager::~AsioContextManager()
{
    //  std::cout << "deleting context manager\n";

    if (isRunning()) {
        try {
            std::lock_guard<std::mutex> nullLock(runningLoopLock);
            nullwork.reset();
            ictx->stop();
            loopRet.get();
        }
        catch (...) {
        }
    } else if (loopRet.valid()) {
        loopRet.get();
    }
    if (leakOnDelete) {
        // yes I am purposefully leaking this PHILIP TOP
        // this capability is needed for some operations on particular OS's with
        // the shared library operations that will crash if this is closed
        // before the library closes which really only happens at program
        // termination
        auto val = ictx.release();
        (void)(val);
    }
}